

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O2

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem *workItem,LARGE_INTEGER *start_time)

{
  byte bVar1;
  FunctionBody *this;
  bool bVar2;
  int iVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  ULONG UVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16 *pcVar7;
  char *pcVar8;
  FunctionCodeGenJitTimeData *pFVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *form;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  WriteBarrierPtr<Js::FieldAccessStats> local_48;
  Type stats;
  
  this = workItem->functionBody;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BackEndPhase);
  if (bVar2) {
    bVar1 = workItem->entryPointInfo->field_0x18;
    iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    if ((bVar1 & 2) == 0) {
      Output::Print(L"---BeginBackEnd: function: %s---\r\n",CONCAT44(extraout_var,iVar3));
    }
    else {
      uVar4 = JsLoopBodyCodeGen::GetLoopNumber((JsLoopBodyCodeGen *)workItem);
      Output::Print(L"---BeginBackEnd: function: %s, loop:%d---\r\n",CONCAT44(extraout_var,iVar3),
                    (ulong)uVar4);
    }
    Output::Flush();
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BackEndPhase,uVar4,LVar5);
  if (bVar2) {
    QueryPerformanceCounter(start_time);
    bVar1 = workItem->entryPointInfo->field_0x18;
    iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    stats.ptr = (FieldAccessStats *)CONCAT44(extraout_var_00,iVar3);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_a8);
    UVar6 = Js::ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
    if ((bVar1 & 2) == 0) {
      pcVar8 = ExecutionModeName((workItem->jitData).jitMode);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), mode: %S",stats.ptr,pcVar7,
                    (ulong)UVar6,pcVar8);
    }
    else {
      uVar4 = JsLoopBodyCodeGen::GetLoopNumber((JsLoopBodyCodeGen *)workItem);
      pcVar8 = ExecutionModeName((workItem->jitData).jitMode);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S",stats.ptr,
                    pcVar7,(ulong)UVar6,(ulong)uVar4,pcVar8);
    }
    form = L" (Asmjs)\n";
    if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 9 & 1) ==
        0) {
      form = L"\n";
    }
    Output::Print(form);
    Output::Flush();
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar4,LVar5);
  if (!bVar2) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar4,LVar5);
    if (!bVar2) {
      return;
    }
  }
  pFVar9 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
  if ((pFVar9->inlineCacheStats).ptr == (FieldAccessStats *)0x0) {
    iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_a8);
    Output::Print(L"EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n",
                  CONCAT44(extraout_var_02,iVar3),pcVar7);
  }
  else {
    pFVar9 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
    Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierSet
              (&local_48,(pFVar9->inlineCacheStats).ptr);
    iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_a8);
    Output::Print(L"ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n",
                  CONCAT44(extraout_var_01,iVar3),pcVar7);
    Output::Print(L"    overall: total %u, no profile info %u\n",
                  (ulong)(local_48.ptr)->totalInlineCacheCount,
                  (ulong)(local_48.ptr)->noInfoInlineCacheCount);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  (ulong)(local_48.ptr)->monoInlineCacheCount,
                  (ulong)(local_48.ptr)->emptyMonoInlineCacheCount,
                  (ulong)(local_48.ptr)->clonedMonoInlineCacheCount);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,(ulong)(local_48.ptr)->polyInlineCacheCount,
                  (ulong)(local_48.ptr)->highUtilPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->lowUtilPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->nullPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->emptyPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->ignoredPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->disabledPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->equivPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->nonEquivPolyInlineCacheCount,
                  (ulong)(local_48.ptr)->clonedPolyInlineCacheCount);
  }
  Output::Flush();
  return;
}

Assistant:

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem * workItem, LARGE_INTEGER * start_time)
{
    Js::FunctionBody * body = workItem->GetFunctionBody();
    {
        if (IS_JS_ETW(EventEnabledJSCRIPT_FUNCTION_JIT_START()))
        {
            WCHAR displayNameBuffer[256];
            WCHAR* displayName = displayNameBuffer;
            size_t sizeInChars = workItem->GetDisplayName(displayName, 256);
            if (sizeInChars > 256)
            {
                displayName = HeapNewArray(WCHAR, sizeInChars);
                workItem->GetDisplayName(displayName, 256);
            }
            JS_ETW(EventWriteJSCRIPT_FUNCTION_JIT_START(
                body->GetFunctionNumber(),
                displayName,
                body->GetScriptContext(),
                workItem->GetInterpretedCount(),
                (const unsigned int)body->LengthInBytes(),
                body->GetByteCodeCount(),
                body->GetByteCodeInLoopCount(),
                (int)workItem->GetJitMode()));

            if (displayName != displayNameBuffer)
            {
                HeapDeleteArray(sizeInChars, displayName);
            }
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::BackEndPhase))
    {
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(_u("---BeginBackEnd: function: %s, loop:%d---\r\n"), body->GetDisplayName(), ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("---BeginBackEnd: function: %s---\r\n"), body->GetDisplayName());
        }
        Output::Flush();
    }
#endif

    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

    if (PHASE_TRACE(Js::BackEndPhase, body))
    {
        QueryPerformanceCounter(start_time);
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber(),
                ExecutionModeName(workItem->GetJitMode()));
            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        else
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ExecutionModeName(workItem->GetJitMode()));

            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        Output::Flush();
    }

#ifdef FIELD_ACCESS_STATS
    if (PHASE_TRACE(Js::ObjTypeSpecPhase, body) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, body))
    {
        if (workItem->RecyclableData()->JitTimeData()->inlineCacheStats)
        {
            auto stats = workItem->RecyclableData()->JitTimeData()->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
        else
        {
            Output::Print(_u("EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
        }
        Output::Flush();
    }
#endif
}